

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio_impl.cpp
# Opt level: O0

void __thiscall ui::Gpio::Fetch(Gpio *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ae8;
  basic_ifstream<char,_std::char_traits<char>_> local_ac8 [520];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c0;
  basic_ifstream<char,_std::char_traits<char>_> local_8a0 [520];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_698;
  basic_ifstream<char,_std::char_traits<char>_> local_678 [520];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_ifstream<char,_std::char_traits<char>_> local_450 [536];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_ifstream<char,_std::char_traits<char>_> local_218 [520];
  Gpio *local_10;
  Gpio *this_local;
  
  local_10 = this;
  std::operator+(&local_238,&this->path_,"/label");
  std::ifstream::ifstream(local_218,(string *)&local_238,_S_in);
  std::operator>>(local_218,&this->label_);
  std::ifstream::~ifstream(local_218);
  std::__cxx11::string::~string((string *)&local_238);
  std::operator+(&local_470,&this->path_,"/edge");
  std::ifstream::ifstream(local_450,(string *)&local_470,_S_in);
  std::operator>>(local_450,&this->edge_);
  std::ifstream::~ifstream(local_450);
  std::__cxx11::string::~string((string *)&local_470);
  std::operator+(&local_698,&this->path_,"/direction");
  std::ifstream::ifstream(local_678,(string *)&local_698,_S_in);
  std::operator>>(local_678,&this->direction_);
  std::ifstream::~ifstream(local_678);
  std::__cxx11::string::~string((string *)&local_698);
  std::operator+(&local_8c0,&this->path_,"/value");
  std::ifstream::ifstream(local_8a0,(string *)&local_8c0,_S_in);
  std::operator>>(local_8a0,&this->value_);
  std::ifstream::~ifstream(local_8a0);
  std::__cxx11::string::~string((string *)&local_8c0);
  std::operator+(&local_ae8,&this->path_,"/active_low");
  std::ifstream::ifstream(local_ac8,(string *)&local_ae8,_S_in);
  std::operator>>(local_ac8,&this->active_low_);
  std::ifstream::~ifstream(local_ac8);
  std::__cxx11::string::~string((string *)&local_ae8);
  return;
}

Assistant:

void Fetch() {
    std::ifstream(path_ + "/label") >> label_;
    std::ifstream(path_ + "/edge") >> edge_;
    std::ifstream(path_ + "/direction") >> direction_;
    std::ifstream(path_ + "/value") >> value_;
    std::ifstream(path_ + "/active_low") >> active_low_;
  }